

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

void lj_lib_prereg(lua_State *L,char *name,lua_CFunction f,GCtab *env)

{
  undefined4 in_ECX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  
  luaL_findtable((lua_State *)env,unaff_retaddr_00,in_RDI,(int)((ulong)in_RSI >> 0x20));
  lua_pushcclosure((lua_State *)env,(lua_CFunction)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                   (int)((ulong)in_RDI >> 0x20));
  *(undefined4 *)((ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8) + 8) = in_ECX;
  lua_setfield(L,name._4_4_,(char *)f);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
  return;
}

Assistant:

void lj_lib_prereg(lua_State *L, const char *name, lua_CFunction f, GCtab *env)
{
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD", 4);
  lua_pushcfunction(L, f);
  /* NOBARRIER: The function is new (marked white). */
  setgcref(funcV(L->top-1)->c.env, obj2gco(env));
  lua_setfield(L, -2, name);
  L->top--;
}